

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint len;
  xmlChar *__dest;
  xmlChar *pxVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  xmlChar *pxVar9;
  int l;
  xmlChar buf [105];
  int local_c0;
  uint local_bc;
  ulong local_b8;
  xmlChar **local_b0;
  xmlChar local_a8 [120];
  
  pxVar9 = *str;
  local_bc = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_bc = 50000;
  }
  iVar3 = xmlStringCurrentChar(ctxt,pxVar9,&local_c0);
  iVar4 = xmlIsNameStartChar(ctxt,iVar3);
  if (iVar4 != 0) {
    if (iVar3 < 0x80) {
      local_a8[0] = (xmlChar)iVar3;
      len = 1;
    }
    else {
      len = xmlCopyCharMultiByte(local_a8,iVar3);
    }
    pxVar9 = pxVar9 + local_c0;
    iVar3 = xmlStringCurrentChar(ctxt,pxVar9,&local_c0);
    do {
      iVar4 = xmlIsNameChar(ctxt,iVar3);
      if (iVar4 == 0) {
        if ((int)local_bc < (int)len) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
          return (xmlChar *)0x0;
        }
        *str = pxVar9;
        pxVar9 = xmlStrndup(local_a8,len);
        if (pxVar9 == (xmlChar *)0x0) {
          xmlCtxtErrMemory(ctxt);
          return (xmlChar *)0x0;
        }
        return pxVar9;
      }
      if (iVar3 < 0x80) {
        local_a8[(int)len] = (xmlChar)iVar3;
        len = len + 1;
      }
      else {
        iVar3 = xmlCopyCharMultiByte(local_a8 + (int)len,iVar3);
        len = len + iVar3;
      }
      pxVar9 = pxVar9 + local_c0;
      iVar3 = xmlStringCurrentChar(ctxt,pxVar9,&local_c0);
    } while ((int)len < 100);
    sVar7 = (size_t)(len * 2);
    local_b0 = str;
    __dest = (xmlChar *)(*xmlMalloc)(sVar7);
    if (__dest != (xmlChar *)0x0) {
      memcpy(__dest,local_a8,(ulong)len);
      do {
        iVar4 = xmlIsNameChar(ctxt,iVar3);
        if (iVar4 == 0) {
          __dest[(int)len] = '\0';
          *local_b0 = pxVar9;
          return __dest;
        }
        iVar4 = (int)sVar7;
        if (iVar4 < (int)(len + 10)) {
          sVar8 = 1;
          if ((0 < iVar4) && (sVar8 = 0xffffffff, iVar4 < (int)local_bc)) {
            uVar6 = iVar4 + 1U >> 1;
            uVar1 = uVar6 + iVar4;
            if ((int)(local_bc - uVar6) < iVar4) {
              uVar1 = local_bc;
            }
            sVar8 = (size_t)uVar1;
          }
          local_b8 = sVar7;
          if ((int)sVar8 < 0) {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
LAB_00141192:
            (*xmlFree)(__dest);
            bVar2 = false;
            sVar7 = local_b8;
          }
          else {
            pxVar5 = (xmlChar *)(*xmlRealloc)(__dest,sVar8);
            if (pxVar5 == (xmlChar *)0x0) {
              xmlCtxtErrMemory(ctxt);
              goto LAB_00141192;
            }
            bVar2 = true;
            __dest = pxVar5;
            sVar7 = sVar8;
          }
          if (!bVar2) {
            return (xmlChar *)0x0;
          }
        }
        if (iVar3 < 0x80) {
          __dest[(int)len] = (xmlChar)iVar3;
          len = len + 1;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(__dest + (int)len,iVar3);
          len = iVar3 + len;
        }
        pxVar9 = pxVar9 + local_c0;
        iVar3 = xmlStringCurrentChar(ctxt,pxVar9,&local_c0);
      } while( true );
    }
    xmlCtxtErrMemory(ctxt);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(buf, len, c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}